

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qthread.cpp
# Opt level: O1

void QThread::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QThread_to_subr *candidate;
  undefined4 uVar2;
  int iVar3;
  Priority priority;
  long in_FS_OFFSET;
  undefined1 local_29;
  void *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if ((((code *)*plVar1 == started) && (uVar2 = 0, plVar1[1] == 0)) ||
       (((code *)*plVar1 == finished && (uVar2 = 1, plVar1[1] == 0)))) {
      *(undefined4 *)*_a = uVar2;
    }
    goto LAB_00347d71;
  }
  if (_c != InvokeMetaMethod) goto LAB_00347d71;
  switch(_id) {
  case 0:
    iVar3 = 0;
    break;
  case 1:
    iVar3 = 1;
    break;
  case 2:
    priority = *_a[1];
    goto LAB_00347cc8;
  case 3:
    priority = InheritPriority;
LAB_00347cc8:
    start((QThread *)_o,priority);
    goto LAB_00347d71;
  case 4:
    terminate((QThread *)_o);
    goto LAB_00347d71;
  case 5:
    iVar3 = *_a[1];
    goto LAB_00347d31;
  case 6:
  case 7:
    iVar3 = 0;
LAB_00347d31:
    exit((QThread *)_o,iVar3);
  default:
    goto LAB_00347d71;
  }
  puStack_20 = &local_29;
  local_28 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_28);
LAB_00347d71:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThread::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QThread *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->started(QPrivateSignal()); break;
        case 1: _t->finished(QPrivateSignal()); break;
        case 2: _t->start((*reinterpret_cast< std::add_pointer_t<Priority>>(_a[1]))); break;
        case 3: _t->start(); break;
        case 4: _t->terminate(); break;
        case 5: _t->exit((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->exit(); break;
        case 7: _t->quit(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QThread::*)(QPrivateSignal)>(_a, &QThread::started, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QThread::*)(QPrivateSignal)>(_a, &QThread::finished, 1))
            return;
    }
}